

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O1

double __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::TanId>_>
::maxErrorAbs(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::TanId>_>
              *this,double x0,double y0,double x1,double y1)

{
  double dVar1;
  double dVar2;
  Error *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  
  if (x0 < x1) {
    (*this->_vptr_BasicPLApproximator[9])();
    (*this->_vptr_BasicPLApproximator[9])(SUB84(x1,0),this);
    dVar1 = ABS((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) - y0);
    dVar2 = ABS((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) - y1);
    if (dVar2 <= dVar1) {
      dVar2 = dVar1;
    }
    (*this->_vptr_BasicPLApproximator[0x20])(SUB84((y1 - y0) / (x1 - x0),0),this);
    (*this->_vptr_BasicPLApproximator[9])(this);
    dVar1 = ABS((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02) -
                ((((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) - x0) * (y1 - y0)) /
                 (x1 - x0) + y0));
    if (dVar1 <= dVar2) {
      dVar1 = dVar2;
    }
    return dVar1;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  Error::Error(this_00,(CStringRef)0x394a9e,-1);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

double BasicPLApproximator<FuncCon>::maxErrorAbs(
    double x0, double y0, double x1, double y1) {
  MP_ASSERT_ALWAYS(x1>x0,
                   "PLApprox maxErrAbs(): degenerate segment, x0>=x1");
  auto f0 = eval(x0);
  auto f1 = eval(x1);
  auto errMax = std::max( std::fabs(f0-y0), std::fabs(f1-y1) );
  auto xMid = inverse_1st_with_check( (y1-y0)/(x1-x0) );
  auto fMid = eval(xMid);
  auto yMid = y0 + (y1-y0) * (xMid-x0) / (x1-x0);
  errMax = std::max( errMax, std::fabs(fMid-yMid) );
  return errMax;
}